

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSVN.cxx
# Opt level: O0

void __thiscall cmCTestSVN::cmCTestSVN(cmCTestSVN *this,cmCTest *ct,ostream *log)

{
  ostream *log_local;
  cmCTest *ct_local;
  cmCTestSVN *this_local;
  
  cmCTestGlobalVC::cmCTestGlobalVC(&this->super_cmCTestGlobalVC,ct,log);
  (this->super_cmCTestGlobalVC).super_cmCTestVC._vptr_cmCTestVC =
       (_func_int **)&PTR__cmCTestSVN_01101158;
  std::__cxx11::list<cmCTestSVN::SVNInfo,_std::allocator<cmCTestSVN::SVNInfo>_>::list
            (&this->Repositories);
  cmCTestVC::Revision::operator=
            (&(this->super_cmCTestGlobalVC).PriorRev,
             &(this->super_cmCTestGlobalVC).super_cmCTestVC.Unknown);
  return;
}

Assistant:

cmCTestSVN::cmCTestSVN(cmCTest* ct, std::ostream& log)
  : cmCTestGlobalVC(ct, log)
{
  this->PriorRev = this->Unknown;
}